

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setViewMode(QFileDialog *this,ViewMode mode)

{
  bool bVar1;
  QFileDialogOptions *pQVar2;
  int in_ESI;
  QFileDialogPrivate *d;
  uint in_stack_fffffffffffffff0;
  
  d_func((QFileDialog *)0x74f69b);
  pQVar2 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x74f6af);
  QFileDialogOptions::setViewMode((ViewMode)pQVar2);
  bVar1 = QFileDialogPrivate::usingWidgets
                    ((QFileDialogPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (bVar1) {
    if (in_ESI == 0) {
      QFileDialogPrivate::showDetailsView((QFileDialogPrivate *)(ulong)in_stack_fffffffffffffff0);
    }
    else {
      QFileDialogPrivate::showListView
                ((QFileDialogPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  return;
}

Assistant:

void QFileDialog::setViewMode(QFileDialog::ViewMode mode)
{
    Q_D(QFileDialog);
    d->options->setViewMode(static_cast<QFileDialogOptions::ViewMode>(mode));
    if (!d->usingWidgets())
        return;
    if (mode == Detail)
        d->showDetailsView();
    else
        d->showListView();
}